

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O0

RK_S32 mpi_enc_opt_qpdd(void *ctx,char *next)

{
  int iVar1;
  MpiEncTestArgs *cmd;
  char *next_local;
  void *ctx_local;
  
  if (next == (char *)0x0) {
    _mpp_log_l(2,"mpi_enc_utils","invalid cu_qp_delta_depth\n",0);
  }
  else {
    iVar1 = atoi(next);
    *(int *)((long)ctx + 0xb0) = iVar1;
  }
  ctx_local._4_4_ = (uint)(next != (char *)0x0);
  return ctx_local._4_4_;
}

Assistant:

RK_S32 mpi_enc_opt_qpdd(void *ctx, const char *next)
{
    MpiEncTestArgs *cmd = (MpiEncTestArgs *)ctx;

    if (next) {
        cmd->cu_qp_delta_depth = atoi(next);
        return 1;
    }

    mpp_err("invalid cu_qp_delta_depth\n");
    return 0;
}